

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

string * fs_longname_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  string_view path;
  error_code eVar1;
  string_view local_60;
  error_category *local_50;
  char *local_48;
  int local_40;
  undefined4 uStack_3c;
  error_category *local_38;
  undefined1 local_30 [8];
  error_code ec;
  string_view in_local;
  
  ec._M_cat = (error_category *)in._M_len;
  std::error_code::error_code((error_code *)local_30);
  eVar1 = std::make_error_code(function_not_supported);
  local_38 = eVar1._M_cat;
  local_40 = eVar1._M_value;
  local_30._4_4_ = uStack_3c;
  local_30._0_4_ = local_40;
  local_50 = ec._M_cat;
  local_48 = in._M_str;
  ec._0_8_ = local_38;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"fs_longname");
  path._M_str = local_48;
  path._M_len = (size_t)local_50;
  fs_print_error(path,local_60,(error_code *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_longname(std::string_view in)
{
// https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getlongpathnamea
// the path must exist

  std::error_code ec;

#if defined(_WIN32) || defined(__CYGWIN__)
  std::string out(fs_get_max_path(), '\0');
// size does not include null terminator

  if(auto L = GetLongPathNameA(in.data(), out.data(), static_cast<DWORD>(out.size()));
      L > 0 && L < out.length()){
    out.resize(L);
    return out;
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(in, __func__, ec);
  return {};
}